

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::GeometricPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,GeometricPrimitive *this,Ray *r
          ,Float tMax)

{
  double dVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  Float FVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 in_XMM3 [16];
  DispatchSplit<12> local_1dd;
  float local_1dc;
  Float va;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined8 uStack_1c4;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1b8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1b0;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_1a8;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_1a0;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_198;
  bool local_98;
  double vb;
  float fStack_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  Float FStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined1 local_5c [16];
  float local_4c;
  
  local_1dc = tMax;
  ShapeHandle::Intersect
            ((optional<pbrt::ShapeIntersection> *)&local_198.__align,&this->shape,r,tMax);
  if (local_98 == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  vb = (double)local_1dc * 1.001;
  _va = (double)CONCAT44(fStack_1d4,local_198._248_4_);
  if (vb <= (double)(float)local_198._248_4_) {
    LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/primitive.cpp"
               ,0x39,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [9])"si->tHit",
               (char (*) [13])"1.001 * tMax",(char (*) [9])"si->tHit",&va,
               (char (*) [13])"1.001 * tMax",&vb);
  }
  dVar1 = (double)(this->alpha).
                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                  .bits;
  if (((ulong)dVar1 & 0xffffffffffff) != 0) {
    auVar3._4_4_ = local_198._4_4_;
    auVar3._0_4_ = local_198._0_4_;
    auVar3._8_4_ = local_198._8_4_;
    auVar3._12_4_ = local_198._12_4_;
    auVar8 = vinsertps_avx(auVar3,ZEXT416((uint)local_198._12_4_),0x10);
    local_68 = local_198._228_4_;
    auVar10._0_4_ = (float)local_198._4_4_ + auVar8._0_4_;
    auVar10._4_4_ = (float)local_198._8_4_ + auVar8._4_4_;
    auVar10._8_4_ = auVar8._8_4_ + 0.0;
    auVar10._12_4_ = auVar8._12_4_ + 0.0;
    auVar8._8_4_ = 0x3f000000;
    auVar8._0_8_ = 0x3f0000003f000000;
    auVar8._12_4_ = 0x3f000000;
    auVar8 = vmulps_avx512vl(auVar10,auVar8);
    FStack_70 = (Float)local_198._220_4_;
    fStack_80 = ((float)local_198._16_4_ + (float)local_198._20_4_) * 0.5;
    vb = (double)vmovlps_avx(auVar8);
    auVar4._8_8_ = local_198._240_8_;
    auVar4._0_8_ = local_198._232_8_;
    local_5c = vpermilps_avx(auVar4,0xd8);
    fStack_7c = (float)local_198._208_8_;
    fStack_78 = (float)((ulong)local_198._208_8_ >> 0x20);
    fStack_74 = (float)local_198._216_4_;
    uStack_64 = local_198._52_4_;
    local_4c = (float)local_198._188_4_;
    _va = dVar1;
    FVar9 = detail::DispatchSplit<12>::operator()(&local_1dd,&vb,&va,(ulong)dVar1 >> 0x30);
    fVar11 = 1.0;
    if (FVar9 < 1.0) {
      if (0.0 < FVar9) {
        uVar6 = *(long *)&(r->d).super_Tuple3<pbrt::Vector3,_float> * -0x395b586ca42e166b;
        uVar7 = *(long *)&(r->o).super_Tuple3<pbrt::Point3,_float> * -0x395b586ca42e166b;
        uVar6 = (((uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                 -0x395b586ca42e166b ^ (ulong)(uint)(r->d).super_Tuple3<pbrt::Vector3,_float>.z) *
                -0x395b586ca42e166b;
        uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b;
        uVar6 = ((uVar6 >> 0x2f ^ (uVar7 >> 0x2f ^ uVar7) * -0x395b586ca42e166b ^ uVar6 ^
                 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^
                (ulong)(uint)(r->o).super_Tuple3<pbrt::Point3,_float>.z) * -0x395b586ca42e166b;
        lVar5 = (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b;
        auVar8 = vcvtusi2ss_avx512f(in_XMM3,(uint)((ulong)lVar5 >> 0x2f) ^ (uint)lVar5);
        fVar11 = auVar8._0_4_ * 2.3283064e-10;
      }
      if (FVar9 < fVar11) {
        if ((local_98 & 1U) == 0) goto LAB_0046bf82;
        Interaction::SpawnRay((RayDifferential *)&vb,(Interaction *)&local_198.__align,&r->d);
        uStack_1c4._4_4_ = FStack_70;
        uStack_1c4._0_4_ = fStack_74;
        local_1b8.bits._4_4_ = uStack_64;
        local_1b8.bits._0_4_ = local_68;
        fStack_1c8 = fStack_78;
        _va = vb;
        fStack_1d0 = fStack_80;
        fStack_1cc = fStack_7c;
        if (local_98 == false) goto LAB_0046bf82;
        Intersect(__return_storage_ptr__,this,(Ray *)&va,local_1dc - (float)local_198._248_4_);
        if (__return_storage_ptr__->set != true) {
          return __return_storage_ptr__;
        }
        if ((local_98 & 1U) == 0) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        local_198._248_4_ =
             (float)local_198._248_4_ +
             *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8);
        goto LAB_0046bf24;
      }
    }
  }
  if ((local_98 & 1U) == 0) {
LAB_0046bf82:
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
  }
  local_1a0.bits =
       (this->material).
       super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
       .bits;
  local_1a8.bits =
       (this->areaLight).
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       .bits;
  local_1b0.bits =
       (r->medium).
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  SurfaceInteraction::SetIntersectionProperties
            ((SurfaceInteraction *)&local_198.__align,(MaterialHandle *)&local_1a0,
             (LightHandle *)&local_1a8,&this->mediumInterface,(MediumHandle *)&local_1b0);
  __return_storage_ptr__->set = local_98;
  if (local_98 != true) {
    return __return_storage_ptr__;
  }
  aVar2._4_4_ = local_198._4_4_;
  aVar2._0_4_ = local_198._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_198._64_8_;
  (__return_storage_ptr__->optionalValue).__align = aVar2;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
       CONCAT44(local_198._12_4_,local_198._8_4_);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       CONCAT44(local_198._20_4_,local_198._16_4_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_198._24_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_198._32_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_198._40_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       CONCAT44(local_198._52_4_,local_198._48_4_);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
       CONCAT44(local_198._60_4_,local_198._56_4_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_198._72_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_198._128_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_198._136_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_198._144_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = local_198._152_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_198._160_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = local_198._168_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = local_198._176_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xb8) =
       CONCAT44(local_198._188_4_,local_198._184_4_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_198._80_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_198._88_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_198._96_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_198._104_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_198._112_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_198._120_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_198._128_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_198._136_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_198._192_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = local_198._200_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_198._240_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_198._208_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xd8) =
       CONCAT44(local_198._220_4_,local_198._216_4_);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
       CONCAT44(local_198._228_4_,local_198._224_4_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_198._232_8_;
LAB_0046bf24:
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_198._248_4_;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> GeometricPrimitive::Intersect(const Ray &r,
                                                                Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);
    // Test intersection against alpha texture, if present
    if (alpha) {
        if (Float a = alpha.Evaluate(si->intr); a < 1) {
            // Potentially skip intersection, depending on stochastic alpha test
            Float u = (a <= 0) ? 1.f : (uint32_t(Hash(r.o, r.d)) * 0x1p-32f);
            if (u > a) {
                // Ignore this intersection and trace a new ray
                Ray rNext = si->intr.SpawnRay(r.d);
                pstd::optional<ShapeIntersection> siNext =
                    Intersect(rNext, tMax - si->tHit);
                if (siNext)
                    siNext->tHit += si->tHit;
                return siNext;
            }
        }
    }

    // Initialize _SurfaceInteraction_ after _Shape_ intersection
    si->intr.SetIntersectionProperties(material, areaLight, &mediumInterface, r.medium);

    return si;
}